

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colWord.c
# Opt level: O0

int HasSynonymField(Col_Word word)

{
  uint local_24;
  uint local_20;
  uint local_1c;
  Col_Word word_local;
  
  if (word == 0) {
    local_1c = 0;
  }
  else {
    if ((word & 0xf) == 0) {
      if ((*(byte *)word & 2) == 0) {
        local_24 = 0xffffffff;
      }
      else {
        local_24 = *(byte *)word & 0xfffffffe;
      }
      local_20 = local_24;
    }
    else {
      local_20 = immediateWordTypes[word & 0x1f];
    }
    local_1c = local_20;
  }
  if ((((local_1c == 0xffffffff) || (local_1c == 2)) || (local_1c == 0x2a)) ||
     (((local_1c == 0x2e || (local_1c == 0x42)) || (local_1c == 0x46)))) {
    word_local._4_4_ = 1;
  }
  else {
    word_local._4_4_ = 0;
  }
  return word_local._4_4_;
}

Assistant:

static int
HasSynonymField(
    Col_Word word)  /*!< The word to test. */
{
    switch (WORD_TYPE(word)) {
    case WORD_TYPE_CUSTOM:
    case WORD_TYPE_WRAP:
    case WORD_TYPE_STRHASHMAP:
    case WORD_TYPE_INTHASHMAP:
    case WORD_TYPE_STRTRIEMAP:
    case WORD_TYPE_INTTRIEMAP:
        return 1;

    /* WORD_TYPE_UNKNOWN */

    default:
        return 0;
    }
}